

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

float tcu::smoothStep(float edge0,float edge1,float x)

{
  float fVar1;
  float t;
  float x_local;
  float edge1_local;
  float edge0_local;
  
  if (edge0 < x) {
    if (x < edge1) {
      fVar1 = de::clamp<float>((x - edge0) / (edge1 - edge0),0.0,1.0);
      edge1_local = fVar1 * fVar1 * (3.0 - (fVar1 + fVar1));
    }
    else {
      edge1_local = 1.0;
    }
  }
  else {
    edge1_local = 0.0;
  }
  return edge1_local;
}

Assistant:

inline float smoothStep		(float edge0, float edge1, float x)
{
	if (x <= edge0) return 0.0f;
	if (x >= edge1) return 1.0f;
	float t = de::clamp((x - edge0) / (edge1 - edge0), 0.0f, 1.0f);
	return t * t * (3.0f - 2.0f * t);
}